

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_1::logAttribList(EglTestContext *eglTestCtx,EGLint *attribList)

{
  ostringstream *this;
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostringstream attribListString;
  string asStack_348 [32];
  ostream local_328;
  undefined1 local_1b0 [384];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  do {
    iVar1 = *attribList;
    do {
      if (iVar1 == 0x3038) {
        std::operator<<(&local_328,"EGL_NONE");
        local_1b0._0_8_ = eglTestCtx->m_testCtx->m_log;
        this = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"EGL attrib list: { ");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)this,asStack_348);
        std::operator<<((ostream *)this," }\n\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string(asStack_348);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
        return;
      }
      if (iVar1 == 0x3138) {
        poVar3 = std::operator<<(&local_328,"EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, ");
        pcVar4 = "<Unknown>";
        if (attribList[1] == 0x31bf) {
          pcVar4 = "EGL_LOSE_CONTEXT_ON_RESET_KHR";
        }
        if (attribList[1] == 0x31be) {
          pcVar4 = "EGL_NO_RESET_NOTIFICATION_KHR";
        }
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,", ");
        goto LAB_00dea191;
      }
      if (iVar1 == 0x30bf) {
        std::operator<<(&local_328,"EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ");
        uVar2 = attribList[1];
        if (uVar2 < 2) {
          pcVar4 = "status == EGL_TRUE";
          if (uVar2 == 0) {
            pcVar4 = "status == EGL_FALSE";
          }
          poVar3 = std::operator<<(&local_328,pcVar4 + 10);
        }
        else {
          poVar3 = (ostream *)std::ostream::operator<<((ostringstream *)&local_328,uVar2);
        }
        std::operator<<(poVar3,", ");
        goto LAB_00dea191;
      }
      if (iVar1 == 0x30fb) {
        poVar3 = std::operator<<(&local_328,"EGL_CONTEXT_MINOR_VERSION_KHR, ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,attribList[1]);
        std::operator<<(poVar3,", ");
        goto LAB_00dea191;
      }
    } while (iVar1 != 0x3098);
    poVar3 = std::operator<<(&local_328,"EGL_CONTEXT_CLIENT_VERSION, ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,attribList[1]);
    std::operator<<(poVar3,", ");
LAB_00dea191:
    attribList = attribList + 2;
  } while( true );
}

Assistant:

void logAttribList (const EglTestContext& eglTestCtx, const EGLint* attribList)
{
	const EGLint*		iter = &(attribList[0]);
	std::ostringstream	attribListString;

	while ((*iter) != EGL_NONE)
	{
		switch (*iter)
		{
		//	case EGL_CONTEXT_CLIENT_VERSION:
			case EGL_CONTEXT_MAJOR_VERSION_KHR:
				iter++;
				attribListString << "EGL_CONTEXT_CLIENT_VERSION, " << (*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_MINOR_VERSION_KHR:
				iter++;
				attribListString << "EGL_CONTEXT_MINOR_VERSION_KHR, " << (*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT:
				iter++;
				attribListString << "EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, "
								 << eglResetNotificationStrategyToString(*iter) << ", ";
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT:
				iter++;
				attribListString << "EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ";

				if (*iter == EGL_FALSE || *iter == EGL_TRUE)
					attribListString << (*iter ? "EGL_TRUE" : "EGL_FALSE") << ", ";
				else
					attribListString << (*iter) << ", ";
				iter++;
				break;

			default:
				DE_FATAL("Unsupported attribute");
		}
	}

	attribListString << "EGL_NONE";
	eglTestCtx.getTestContext().getLog() << TestLog::Message
										 << "EGL attrib list: { " << attribListString.str() << " }\n\n"
										 << TestLog::EndMessage;
}